

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

unsigned_long_long
pugi::impl::anon_unknown_0::get_value_ullong(char_t *value,unsigned_long_long def)

{
  int __base;
  ulonglong uVar1;
  
  if (value != (char_t *)0x0) {
    __base = get_integer_base(value);
    uVar1 = strtoull(value,(char **)0x0,__base);
    return uVar1;
  }
  return def;
}

Assistant:

PUGI__FN unsigned long long get_value_ullong(const char_t* value, unsigned long long def)
	{
		if (!value) return def;

		int base = get_integer_base(value);

	#ifdef PUGIXML_WCHAR_MODE
		#ifdef PUGI__MSVC_CRT_VERSION
			return _wcstoui64(value, 0, base);
		#else
			return wcstoull(value, 0, base);
		#endif
	#else
		#ifdef PUGI__MSVC_CRT_VERSION
			return _strtoui64(value, 0, base);
		#else
			return strtoull(value, 0, base);
		#endif
	#endif
	}